

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

void __thiscall Assimp::BatchLoader::~BatchLoader(BatchLoader *this)

{
  aiScene *this_00;
  BatchData *this_01;
  _List_node_base *p_Var1;
  
  this_01 = this->m_data;
  p_Var1 = (_List_node_base *)&this_01->requests;
  while (p_Var1 = (((_List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this_01->requests) {
    this_00 = (aiScene *)p_Var1[3]._M_prev;
    if (this_00 != (aiScene *)0x0) {
      aiScene::~aiScene(this_00);
    }
    operator_delete(this_00,0x80);
    this_01 = this->m_data;
  }
  if (this_01 != (BatchData *)0x0) {
    BatchData::~BatchData(this_01);
  }
  operator_delete(this_01,0x50);
  return;
}

Assistant:

BatchLoader::~BatchLoader()
{
    // delete all scenes what have not been polled by the user
    for ( LoadReqIt it = m_data->requests.begin();it != m_data->requests.end(); ++it) {
        delete (*it).scene;
    }
    delete m_data;
}